

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O0

float Rml::ComputeFontsize
                (NumericValue value,ComputedValues *values,ComputedValues *parent_values,
                ComputedValues *document_values,float dp_ratio,Vector2f vp_dimensions)

{
  bool bVar1;
  Units UVar2;
  ComputedValues *this;
  float fVar3;
  float local_40;
  float multiplier;
  float dp_ratio_local;
  ComputedValues *document_values_local;
  ComputedValues *parent_values_local;
  ComputedValues *values_local;
  Vector2f vp_dimensions_local;
  NumericValue value_local;
  
  vp_dimensions_local.y = (float)value.unit;
  UVar2 = operator|(PERCENT,EM);
  UVar2 = operator|(UVar2,REM);
  UVar2 = operator&((Units)vp_dimensions_local.y,UVar2);
  bVar1 = Any(UVar2);
  if (bVar1) {
    local_40 = 1.0;
    vp_dimensions_local.x = value.number;
    if (vp_dimensions_local.y == 4.48416e-44) {
      local_40 = 0.01;
    }
    else if (vp_dimensions_local.y != 2.86986e-42) {
      if (vp_dimensions_local.y == 5.73972e-42) {
        if ((document_values != (ComputedValues *)0x0) && (values != document_values)) {
          fVar3 = Style::ComputedValues::font_size(document_values);
          return vp_dimensions_local.x * fVar3;
        }
        this = DefaultComputedValues();
        fVar3 = Style::ComputedValues::font_size(this);
        return vp_dimensions_local.x * fVar3;
      }
      goto LAB_004c44f0;
    }
    if (parent_values == (ComputedValues *)0x0) {
      value_local.number = 0.0;
    }
    else {
      fVar3 = Style::ComputedValues::font_size(parent_values);
      value_local.number = vp_dimensions_local.x * local_40 * fVar3;
    }
  }
  else {
LAB_004c44f0:
    value_local.number = ComputeLength(value,0.0,0.0,dp_ratio,vp_dimensions);
  }
  return value_local.number;
}

Assistant:

float ComputeFontsize(NumericValue value, const Style::ComputedValues& values, const Style::ComputedValues* parent_values,
	const Style::ComputedValues* document_values, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(value.unit & (Unit::PERCENT | Unit::EM | Unit::REM)))
	{
		// Relative values are based on the parent's or document's font size instead of our own.
		float multiplier = 1.0f;

		switch (value.unit)
		{
		case Unit::PERCENT:
			multiplier = 0.01f;
			//-fallthrough
		case Unit::EM:
			if (!parent_values)
				return 0;
			return value.number * multiplier * parent_values->font_size();

		case Unit::REM:
			// If the current element is a document, the rem unit is relative to the default size.
			if (!document_values || &values == document_values)
				return value.number * DefaultComputedValues().font_size();

			// Otherwise it is relative to the document font size.
			return value.number * document_values->font_size();
		default: break;
		}
	}

	// Font-relative lengths handled above, other lengths should be handled as normal.
	return ComputeLength(value, 0.f, 0.f, dp_ratio, vp_dimensions);
}